

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.c
# Opt level: O1

void pre_auth_append(pre_auth *pa,uint8_t *data,size_t len)

{
  int j;
  long lVar1;
  ulong uVar2;
  uint8_t *puVar3;
  
  puVar3 = pa->current;
  lVar1 = 0;
  uVar2 = len & 0xffffffff;
  do {
    puVar3[lVar1] = (uint8_t)uVar2;
    lVar1 = lVar1 + 1;
    uVar2 = 0;
  } while (lVar1 != 8);
  puVar3 = puVar3 + 8;
  pa->current = puVar3;
  if (len != 0) {
    memcpy(puVar3,data,len);
  }
  pa->current = pa->current + len;
  return;
}

Assistant:

void pre_auth_append(struct pre_auth *pa, const uint8_t *data, size_t len) {
    pa->current = le64(pa->current, len);
    if (len > 0) memcpy(pa->current, data, len);
    pa->current += len;
}